

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O3

void __thiscall QGraphicsView::dragMoveEvent(QGraphicsView *this,QDragMoveEvent *event)

{
  QGraphicsViewPrivate *this_00;
  Data *pDVar1;
  QObject *pQVar2;
  long in_FS_OFFSET;
  undefined1 local_38 [12];
  char cStack_2c;
  QScopedPointer<QGraphicsSceneEventPrivate,_QScopedPointerDeleter<QGraphicsSceneEventPrivate>_>
  local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsViewPrivate **)(this + 8);
  pDVar1 = (this_00->scene).wp.d;
  if ((((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
      ((this_00->scene).wp.value != (QObject *)0x0)) && ((this_00->field_0x300 & 1) != 0)) {
    local_28.d = (QGraphicsSceneEventPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    stack0xffffffffffffffd0 = &DAT_aaaaaaaaaaaaaaaa;
    QGraphicsSceneDragDropEvent::QGraphicsSceneDragDropEvent
              ((QGraphicsSceneDragDropEvent *)local_38,GraphicsSceneDragMove);
    QGraphicsViewPrivate::populateSceneDragDropEvent
              (this_00,(QGraphicsSceneDragDropEvent *)local_38,(QDropEvent *)event);
    QGraphicsViewPrivate::storeDragDropEvent(this_00,(QGraphicsSceneDragDropEvent *)local_38);
    pDVar1 = (this_00->scene).wp.d;
    if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
      pQVar2 = (QObject *)0x0;
    }
    else {
      pQVar2 = (this_00->scene).wp.value;
    }
    QCoreApplication::sendEvent(pQVar2,(QEvent *)local_38);
    (**(code **)(*(long *)event + 0x10))(event,cStack_2c);
    if (cStack_2c == '\x01') {
      QGraphicsSceneDragDropEvent::dropAction((QGraphicsSceneDragDropEvent *)local_38);
      QDropEvent::setDropAction((DropAction)event);
    }
    QGraphicsSceneHelpEvent::~QGraphicsSceneHelpEvent((QGraphicsSceneHelpEvent *)local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsView::dragMoveEvent(QDragMoveEvent *event)
{
    Q_D(QGraphicsView);
    if (!d->scene || !d->sceneInteractionAllowed)
        return;

    // Generate a scene event.
    QGraphicsSceneDragDropEvent sceneEvent(QEvent::GraphicsSceneDragMove);
    d->populateSceneDragDropEvent(&sceneEvent, event);

    // Store it for later use.
    d->storeDragDropEvent(&sceneEvent);

    // Send it to the scene.
    QCoreApplication::sendEvent(d->scene, &sceneEvent);

    // Ignore the originating event if the scene ignored the scene event.
    event->setAccepted(sceneEvent.isAccepted());
    if (sceneEvent.isAccepted())
        event->setDropAction(sceneEvent.dropAction());
}